

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O0

void __thiscall Fastzip::addDir(Fastzip *this,PathAlias *dirName,PackFormat format)

{
  char *pcVar1;
  char *pcVar2;
  string *dirName_00;
  int iVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  anon_class_32_4_cefc277a local_a0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_80;
  char *local_60;
  char *fn;
  size_type last;
  undefined1 local_48 [4];
  int skipLen;
  string *local_28;
  string *d;
  PathAlias *pPStack_18;
  PackFormat format_local;
  PathAlias *dirName_local;
  Fastzip *this_local;
  
  d._4_4_ = format;
  pPStack_18 = dirName;
  dirName_local = (PathAlias *)this;
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            ((string_type *)local_48,&dirName->diskPath);
  local_28 = (string *)local_48;
  last._4_4_ = 0;
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 0) {
    if ((this->junkPaths & 1U) == 0) {
      local_60 = (char *)std::__cxx11::string::c_str();
      if (local_60[1] == ':') {
        local_60 = local_60 + 2;
      }
      while( true ) {
        bVar6 = true;
        if ((*local_60 != '/') && (bVar6 = true, *local_60 != '\\')) {
          bVar6 = *local_60 == '.';
        }
        if (!bVar6) break;
        local_60 = local_60 + 1;
      }
      while( true ) {
        pcVar1 = local_60;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar2 = local_60;
        bVar6 = false;
        if (pcVar5 < pcVar1) {
          bVar6 = local_60[-1] == '.';
        }
        if (!bVar6) break;
        local_60 = local_60 + -1;
      }
      iVar3 = std::__cxx11::string::c_str();
      last._4_4_ = (int)pcVar2 - iVar3;
    }
    else {
      fn = (char *)std::__cxx11::string::find_last_of((char *)local_28,0x237967);
      if (fn != (char *)0xffffffffffffffff) {
        last._4_4_ = (int)fn + 1;
      }
    }
  }
  else {
    last._4_4_ = std::__cxx11::string::length();
  }
  dirName_00 = local_28;
  local_a0.skipLen = (int *)((long)&last + 4);
  local_a0.format = (PackFormat *)((long)&d + 4);
  local_a0.dirName = pPStack_18;
  local_a0.this = this;
  std::function<void(std::__cxx11::string_const&)>::
  function<Fastzip::addDir(PathAlias_const&,PackFormat)::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_80,&local_a0);
  listFiles(dirName_00,&local_80);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Fastzip::addDir(const PathAlias& dirName, PackFormat format)
{
    const string& d = dirName.diskPath;

    // Set 'skipLen' to the number of chars to strip from the start of each path
    // name
    int skipLen = 0;
    if (dirName.aliasTo.length() > 0) {
        skipLen = d.length();
    } else if (junkPaths) {
        auto last = d.find_last_of("\\/");
        if (last != string::npos)
            skipLen = last + 1;
    } else {
        const char* fn = d.c_str();
        // Skip DOS drive letter
        if (fn[1] == ':')
            fn += 2;

        // Skip path prefixes such as '/' or '../../'
        while (*fn == '/' || *fn == '\\' || *fn == '.')
            fn++;
        while (fn > d.c_str() && fn[-1] == '.')
            fn--;
        skipLen = fn - d.c_str();
    }

    // Recursivly add all files to fileNames
    listFiles(d, [&](const string& path) {
        string target = path.substr(skipLen);
        PackFormat pf = format;

        if (!storeExts.empty()) {
            const char* ext = nullptr;
            auto dot = path.find_last_of('.');
            if (dot != string::npos)
                ext = &path.c_str()[dot + 1];
            if (ext && *ext) {
                for (const auto& se : storeExts) {
                    if (strcmp(se.c_str(), ext) == 0) {
                        pf = UNCOMPRESSED;
                        break;
                    }
                }
            }
        }

        if (dirName.aliasTo.length()) {
            target = dirName.aliasTo + target;
        }
        for (auto& t : target)
            if (t == '\\')
                t = '/';
        strLen += target.length();

        fileNames.emplace_back(path, target, pf);
    });
}